

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_ManPrintBoxInfoSorted(Au_Ntk_t *pNtk)

{
  void **__src;
  uint uVar1;
  int iVar2;
  Au_Man_t *pAVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  void *__dest;
  long lVar6;
  ulong uVar7;
  
  pAVar3 = pNtk->pMan;
  if (pAVar3 == (Au_Man_t *)0x0) {
    puts("There is no hierarchy information.");
    return;
  }
  iVar2 = (pAVar3->vNtks).nSize;
  uVar1 = iVar2 - 1;
  (pAVar3->vNtks).nSize = uVar1;
  ppvVar4 = (pAVar3->vNtks).pArray;
  __src = ppvVar4 + 1;
  (pAVar3->vNtks).pArray = __src;
  lVar6 = (long)(pAVar3->vNtks).nCap;
  if (lVar6 == 0) {
    __dest = (void *)0x0;
  }
  else {
    __dest = malloc(lVar6 << 3);
  }
  memcpy(__dest,__src,(long)(int)uVar1 << 3);
  (pAVar3->vNtks).pArray = ppvVar4;
  (pAVar3->vNtks).nSize = iVar2;
  if (iVar2 < 3) {
    if (__dest == (void *)0x0) {
      return;
    }
  }
  else {
    qsort(__dest,(ulong)uVar1,8,Au_NtkCompareSign);
    uVar7 = 1;
    do {
      puVar5 = *(undefined8 **)((long)__dest + uVar7 * 8);
      printf("MODULE  ");
      printf("%-30s : ",*puVar5);
      printf("PI=%6d ",(ulong)*(uint *)(puVar5 + 10));
      printf("PO=%6d ",(ulong)*(uint *)((long)puVar5 + 0x54));
      printf("BB=%6d ",(ulong)*(uint *)(puVar5 + 0xc));
      printf("ND=%6d ",(ulong)*(uint *)((long)puVar5 + 100));
      putchar(10);
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  free(__dest);
  return;
}

Assistant:

void Au_ManPrintBoxInfoSorted( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods, * vModsNew;
    Au_Ntk_t * pModel;
    int i;
    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return;
    }
    vMods = &pNtk->pMan->vNtks;

    vMods->nSize--;
    vMods->pArray++;
    vModsNew = Vec_PtrDup( vMods );
    vMods->pArray--;
    vMods->nSize++;

    Vec_PtrSort( vModsNew, (int(*)())Au_NtkCompareSign );
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vModsNew, pModel, i, 1 )
    {
        printf( "MODULE  " );
        printf( "%-30s : ", Au_NtkName(pModel) );
        printf( "PI=%6d ", Au_NtkPiNum(pModel) );
        printf( "PO=%6d ", Au_NtkPoNum(pModel) );
        printf( "BB=%6d ", Au_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Au_NtkNodeNum(pModel) );
        printf( "\n" );
    }
    Vec_PtrFree( vModsNew );
}